

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O1

void __thiscall
chrono::ChFunction_Mocap::ChFunction_Mocap(ChFunction_Mocap *this,int m_samples,double freq)

{
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Mocap_00b6cd50;
  (this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->array_y).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->array_y_dt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  (this->array_y_dtdt).super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  Set_samples(this,m_samples);
  this->samp_freq = freq;
  this->timetot = (double)this->samples / freq;
  return;
}

Assistant:

ChFunction_Mocap::ChFunction_Mocap(int m_samples, double freq) {
    Set_samples(m_samples);  // this creates arrays
    Set_samp_freq(freq);
}